

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# web_peer_connection.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::web_peer_connection::on_receive
          (web_peer_connection *this,error_code *error,size_t bytes_transferred)

{
  weak_ptr<libtorrent::aux::torrent> *pwVar1;
  receive_buffer *this_00;
  _Elt_pointer pfVar2;
  web_seed_t *pwVar3;
  ulong_long_type uVar4;
  bool bVar5;
  int iVar6;
  _Base_ptr p_Var7;
  string *psVar8;
  int iVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  file_request_t *file_req;
  char *pcVar14;
  uint uVar15;
  long lVar16;
  span<const_char> recv_buffer;
  span<const_char> buf;
  string_view key;
  span<const_char> sVar17;
  error_code_enum val;
  int header_size;
  char *local_b0;
  _Elt_pointer local_a8;
  http_parser *local_a0;
  int64_t chunk_size;
  error_code ec;
  bool failed;
  shared_ptr<libtorrent::aux::torrent> t;
  
  if (error->failed_ == true) {
    peer_connection::received_bytes((peer_connection *)this,0,(int)bytes_transferred);
    bVar5 = peer_connection::should_log((peer_connection *)this,info);
    if (bVar5) {
      (*error->cat_->_vptr_error_category[4])(&ec,error->cat_,(ulong)(uint)error->val_);
      peer_connection::peer_log
                ((peer_connection *)this,info,"ERROR","web_peer_connection error: %s",
                 CONCAT44(ec._4_4_,ec.val_));
      ::std::__cxx11::string::~string((string *)&ec);
    }
  }
  else {
    pwVar1 = &(this->super_web_connection_base).super_peer_connection.
              super_peer_connection_hot_members.m_torrent;
    ::std::__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::__weak_ptr
              ((__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)&ec,
               &pwVar1->super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>);
    ::std::__shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>,&ec);
    ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
              ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)&ec.cat_);
    this_00 = &(this->super_web_connection_base).super_peer_connection.m_recv_buffer;
    sVar17 = receive_buffer::get(this_00);
    handle_padfile(this);
    ::std::__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::__weak_ptr
              ((__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)&ec,
               &pwVar1->super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>);
    if (ec.cat_ == (error_category *)0x0) {
      ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
                ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)&ec.cat_);
    }
    else {
      uVar4 = (ec.cat_)->id_;
      ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
                ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)&ec.cat_);
      if ((int)uVar4 != 0) {
        local_a0 = &(this->super_web_connection_base).m_parser;
        do {
          pcVar14 = sVar17.m_ptr;
          if ((this->super_web_connection_base).m_parser.m_state == read_body) {
LAB_00340ee4:
            lVar16 = sVar17.m_len;
            pcVar14 = sVar17.m_ptr;
            if (lVar16 == 0) goto LAB_00341589;
            ec.val_ = 0;
            ec._4_4_ = ec._4_4_ & 0xffffff00;
            ec.cat_ = &boost::system::detail::cat_holder<void>::system_category_instance.
                       super_error_category;
            if ((this->super_web_connection_base).m_parser.m_status_code == 0xce) {
              lVar10 = (this->super_web_connection_base).m_parser.m_range_start;
              lVar13 = (this->super_web_connection_base).m_parser.m_range_end;
              if (lVar13 < lVar10 || lVar10 < 0) {
                val = invalid_range;
LAB_00340fff:
                boost::system::error_code::operator=(&ec,val);
                lVar13 = 0;
                goto LAB_00341008;
              }
              lVar13 = lVar13 + 1;
            }
            else {
              lVar13 = (this->super_web_connection_base).m_parser.m_content_length;
              if (lVar13 < 0) {
                val = no_content_length;
                goto LAB_00340fff;
              }
LAB_00341008:
              lVar10 = 0;
            }
            iVar9 = (int)sVar17.m_len;
            if (ec.failed_ == true) {
              peer_connection::received_bytes((peer_connection *)this,0,iVar9);
              disable(this,&ec);
              iVar9 = 1;
            }
            else {
              local_a8 = (this->m_file_requests).
                         super__Deque_base<libtorrent::aux::web_peer_connection::file_request_t,_std::allocator<libtorrent::aux::web_peer_connection::file_request_t>_>
                         ._M_impl.super__Deque_impl_data._M_start._M_cur;
              local_b0 = pcVar14;
              if ((lVar10 == local_a8->start) && (lVar13 == lVar10 + local_a8->length)) {
                if ((this->super_web_connection_base).m_parser.m_chunked_encoding == true) {
                  iVar9 = this->m_chunk_pos;
                  do {
                    if (iVar9 < 0) goto LAB_0034148c;
                    if (iVar9 == 0) {
                      iVar6 = 0;
                    }
                    else {
                      iVar6 = (int)sVar17.m_len;
                      if (iVar6 <= iVar9) {
                        iVar9 = iVar6;
                      }
                      if (local_a8->length < this->m_received_body + iVar9) {
                        peer_connection::received_bytes((peer_connection *)this,0,iVar6);
                        peer_connection::peer_log
                                  ((peer_connection *)this,incoming,"INVALID HTTP RESPONSE",
                                   "received body: %d request size: %d",
                                   (ulong)(uint)this->m_received_body,(ulong)(uint)local_a8->length)
                        ;
                        boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                                  ((error_code *)&failed,invalid_range,(type *)0x0);
                        (*(this->super_web_connection_base).super_peer_connection.
                          super_bandwidth_socket._vptr_bandwidth_socket[0x14])
                                  (this,(error_code *)&failed,1,2);
                        goto LAB_00340fe5;
                      }
                      incoming_payload(this,sVar17.m_ptr,iVar9);
                      pcVar14 = sVar17.m_ptr + iVar9;
                      iVar6 = this->m_chunk_pos - iVar9;
                      this->m_chunk_pos = iVar6;
                      lVar16 = sVar17.m_len - (long)iVar9;
                      sVar17.m_len = lVar16;
                      sVar17.m_ptr = pcVar14;
                      if (lVar16 == 0) break;
                    }
                    header_size = 0;
                    chunk_size = 0;
                    lVar16 = sVar17.m_len - (long)iVar6;
                    buf.m_len = lVar16;
                    buf.m_ptr = sVar17.m_ptr + iVar6;
                    bVar5 = http_parser::parse_chunk_header(local_a0,buf,&chunk_size,&header_size);
                    if (!bVar5) {
                      iVar9 = (int)lVar16;
                      peer_connection::received_bytes
                                ((peer_connection *)this,0,iVar9 - this->m_partial_chunk_header);
                      this->m_partial_chunk_header = iVar9;
                      goto LAB_0034142f;
                    }
                    peer_connection::peer_log
                              ((peer_connection *)this,info,"CHUNKED_ENCODING",
                               "parsed chunk: %ld header_size: %d",chunk_size,
                               (ulong)(uint)header_size);
                    peer_connection::received_bytes
                              ((peer_connection *)this,0,header_size - this->m_partial_chunk_header)
                    ;
                    this->m_partial_chunk_header = 0;
                    iVar9 = this->m_chunk_pos + (int)chunk_size;
                    this->m_chunk_pos = iVar9;
                    pcVar14 = sVar17.m_ptr + header_size;
                    lVar16 = sVar17.m_len - (long)header_size;
                    sVar17.m_len = lVar16;
                    sVar17.m_ptr = pcVar14;
                    if (chunk_size == 0) {
                      this->m_chunk_pos = -1;
                      if (this->m_received_body != local_a8->length) {
                        peer_connection::received_bytes((peer_connection *)this,0,(int)lVar16);
                        peer_connection::peer_log
                                  ((peer_connection *)this,incoming,"INVALID HTTP RESPONSE",
                                   "received body: %d request size: %d",
                                   (ulong)(uint)this->m_received_body,(ulong)(uint)local_a8->length)
                        ;
                        boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                                  ((error_code *)&failed,invalid_range,(type *)0x0);
                        (*(this->super_web_connection_base).super_peer_connection.
                          super_bandwidth_socket._vptr_bandwidth_socket[0x14])
                                  (this,(error_code *)&failed,1,2);
                        goto LAB_00340fe5;
                      }
                      ::std::
                      deque<libtorrent::aux::web_peer_connection::file_request_t,_std::allocator<libtorrent::aux::web_peer_connection::file_request_t>_>
                      ::pop_front(&this->m_file_requests);
                      http_parser::reset(local_a0);
                      (this->super_web_connection_base).m_body_start = 0;
                      this->m_received_body = 0;
                      this->m_chunk_pos = 0;
                      this->m_partial_chunk_header = 0;
                      handle_padfile(this);
                      goto LAB_0034148c;
                    }
                  } while (lVar16 != 0);
                  sVar17.m_len = 0;
                  sVar17.m_ptr = pcVar14;
LAB_0034142f:
                  iVar9 = 0x1a;
                }
                else {
                  iVar6 = local_a8->length - this->m_received_body;
                  if (iVar9 <= iVar6) {
                    iVar6 = iVar9;
                  }
                  incoming_payload(this,pcVar14,iVar6);
                  local_b0 = local_b0 + iVar6;
                  lVar16 = lVar16 - iVar6;
                  sVar17.m_len = lVar16;
                  sVar17.m_ptr = local_b0;
                  if (this->m_received_body == local_a8->length) {
                    ::std::
                    deque<libtorrent::aux::web_peer_connection::file_request_t,_std::allocator<libtorrent::aux::web_peer_connection::file_request_t>_>
                    ::pop_front(&this->m_file_requests);
                    http_parser::reset(local_a0);
                    (this->super_web_connection_base).m_body_start = 0;
                    this->m_received_body = 0;
                    this->m_chunk_pos = 0;
                    this->m_partial_chunk_header = 0;
                    handle_padfile(this);
                    sVar17.m_ptr = local_b0;
                  }
LAB_0034148c:
                  local_b0 = sVar17.m_ptr;
                  iVar9 = 0;
                  if (sVar17.m_len == 0) {
                    iVar9 = 6;
                  }
                }
              }
              else {
                peer_connection::received_bytes((peer_connection *)this,0,iVar9);
                bVar5 = peer_connection::should_log((peer_connection *)this,incoming);
                sVar17.m_len = lVar16;
                sVar17.m_ptr = local_b0;
                if (bVar5) {
                  uVar12 = (ulong)(uint)(local_a8->file_index).m_val;
                  peer_connection::peer_log
                            ((peer_connection *)this,incoming,"INVALID HTTP RESPONSE",
                             "in=(%d, %ld-%ld) expected=(%d, %ld-%ld) ]",uVar12,lVar10,lVar13,uVar12
                             ,local_a8->start,local_a8->start + (long)local_a8->length + -1);
                }
                boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                          ((error_code *)&failed,invalid_range,(type *)0x0);
                (*(this->super_web_connection_base).super_peer_connection.super_bandwidth_socket.
                  _vptr_bandwidth_socket[0x14])(this,(error_code *)&failed,1,2);
                iVar9 = 1;
              }
            }
          }
          else {
            failed = false;
            recv_buffer.m_len = (difference_type)pcVar14;
            recv_buffer.m_ptr = (char *)local_a0;
            http_parser::incoming((http_parser *)&ec,recv_buffer,(bool *)sVar17.m_len);
            peer_connection::received_bytes((peer_connection *)this,0,ec.val_);
            uVar15 = (uint)sVar17.m_len;
            if (failed == true) {
              peer_connection::received_bytes((peer_connection *)this,0,uVar15);
              bVar5 = peer_connection::should_log((peer_connection *)this,info);
              if (bVar5) {
                peer_connection::peer_log
                          ((peer_connection *)this,info,"RECEIVE_BYTES","%*s",(ulong)uVar15,pcVar14)
                ;
              }
              boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                        (&ec,http_parse_error,(type *)0x0);
              (*(this->super_web_connection_base).super_peer_connection.super_bandwidth_socket.
                _vptr_bandwidth_socket[0x14])(this,&ec,1,2);
LAB_00340fe5:
              iVar9 = 1;
            }
            else {
              iVar9 = 6;
              if (((this->super_web_connection_base).m_parser.m_status_code != -1) &&
                 ((this->super_web_connection_base).m_parser.m_state == read_body)) {
                (this->super_web_connection_base).m_body_start =
                     (this->super_web_connection_base).m_parser.m_body_start_pos;
                this->m_received_body = 0;
                this->m_num_responses = this->m_num_responses + 1;
                if (((this->super_web_connection_base).m_parser.m_connection_close == true) &&
                   (peer_connection::incoming_choke((peer_connection *)this),
                   this->m_num_responses == 1)) {
                  this->m_web->supports_keepalive = false;
                }
                bVar5 = peer_connection::should_log((peer_connection *)this,info);
                if (bVar5) {
                  peer_connection::peer_log
                            ((peer_connection *)this,info,"STATUS","%d %s",
                             (ulong)(uint)(this->super_web_connection_base).m_parser.m_status_code,
                             (this->super_web_connection_base).m_parser.m_server_message._M_dataplus
                             ._M_p);
                  for (p_Var7 = (this->super_web_connection_base).m_parser.m_header._M_t._M_impl.
                                super__Rb_tree_header._M_header._M_left;
                      (_Rb_tree_header *)p_Var7 !=
                      &(this->super_web_connection_base).m_parser.m_header._M_t._M_impl.
                       super__Rb_tree_header; p_Var7 = (_Base_ptr)::std::_Rb_tree_increment(p_Var7))
                  {
                    peer_connection::peer_log
                              ((peer_connection *)this,info,"STATUS","   %s: %s",
                               *(undefined8 *)(p_Var7 + 1),*(undefined8 *)(p_Var7 + 2));
                  }
                }
                bVar5 = is_ok_status((this->super_web_connection_base).m_parser.m_status_code);
                if (bVar5) {
                  bVar5 = is_redirect((this->super_web_connection_base).m_parser.m_status_code);
                  if (!bVar5) {
                    key._M_str = "server";
                    key._M_len = 6;
                    psVar8 = http_parser::header_abi_cxx11_(local_a0,key);
                    if (psVar8->_M_string_length == 0) {
                      psVar8 = &(this->super_web_connection_base).m_host;
                    }
                    ::std::__cxx11::string::string((string *)&ec,(string *)psVar8);
                    ::std::__cxx11::string::operator=
                              ((string *)&(this->super_web_connection_base).m_server_string,
                               (string *)&ec);
                    ::std::__cxx11::string::~string((string *)&ec);
                    lVar16 = (long)(this->super_web_connection_base).m_body_start;
                    sVar17.m_len = (long)sVar17.m_len - lVar16;
                    sVar17.m_ptr = pcVar14 + lVar16;
                    (this->super_web_connection_base).m_body_start =
                         (this->super_web_connection_base).m_parser.m_body_start_pos;
                    this->m_received_body = 0;
                    goto LAB_00340ee4;
                  }
                  handle_redirect(this,uVar15);
                }
                else {
                  pfVar2 = (this->m_file_requests).
                           super__Deque_base<libtorrent::aux::web_peer_connection::file_request_t,_std::allocator<libtorrent::aux::web_peer_connection::file_request_t>_>
                           ._M_impl.super__Deque_impl_data._M_start._M_cur;
                  if ((this->m_file_requests).
                      super__Deque_base<libtorrent::aux::web_peer_connection::file_request_t,_std::allocator<libtorrent::aux::web_peer_connection::file_request_t>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_cur != pfVar2) {
                    pwVar3 = this->m_web;
                    iVar9 = file_storage::num_files
                                      (&(((t.
                                           super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr)->super_torrent_hot_members).m_torrent_file.
                                         super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr)->m_files);
                    bitfield::resize(&(pwVar3->have_files).super_bitfield,iVar9,true);
                    bitfield::clear_bit(&(this->m_web->have_files).super_bitfield,
                                        (pfVar2->file_index).m_val);
                    peer_connection::peer_log
                              ((peer_connection *)this,info,"MISSING_FILE",
                               "http-code: %d | file: %d",
                               (ulong)(uint)(this->super_web_connection_base).m_parser.m_status_code
                               ,(ulong)(uint)(pfVar2->file_index).m_val);
                  }
                  handle_error(this,uVar15);
                }
                goto LAB_003415ca;
              }
            }
          }
          pcVar14 = sVar17.m_ptr;
        } while (iVar9 == 0);
        if ((iVar9 == 6) || (iVar9 == 0x1a)) {
LAB_00341589:
          sVar17 = receive_buffer::get(this_00);
          uVar15 = ((((t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->super_torrent_hot_members).m_torrent_file.
                     super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                    )->m_files).m_piece_length;
          uVar11 = 0x4000;
          if (uVar15 < 0x4000) {
            uVar11 = uVar15;
          }
          iVar9 = 0x5388;
          if (0 < (int)uVar15) {
            iVar9 = uVar11 + 5000;
          }
          receive_buffer::cut(this_00,(int)pcVar14 - (int)sVar17.m_ptr,iVar9,0);
        }
      }
    }
LAB_003415ca:
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  return;
}

Assistant:

void web_peer_connection::on_receive(error_code const& error
	, std::size_t bytes_transferred)
{
	INVARIANT_CHECK;

	if (error)
	{
		received_bytes(0, int(bytes_transferred));
#ifndef TORRENT_DISABLE_LOGGING
		if (should_log(peer_log_alert::info))
		{
			peer_log(peer_log_alert::info, "ERROR"
				, "web_peer_connection error: %s", error.message().c_str());
		}
#endif
		return;
	}

	auto t = associated_torrent().lock();
	TORRENT_ASSERT(t);

	// in case the first file on this series of requests is a padfile
	// we need to handle it right now
	span<char const> recv_buffer = m_recv_buffer.get();
	handle_padfile();
	if (associated_torrent().expired()) return;

	for (;;)
	{
		int payload;
		int protocol;
		bool header_finished = m_parser.header_finished();
		if (!header_finished)
		{
			bool failed = false;
			std::tie(payload, protocol) = m_parser.incoming(recv_buffer, failed);
			received_bytes(0, protocol);
			TORRENT_ASSERT(int(recv_buffer.size()) >= protocol);

			if (failed)
			{
				received_bytes(0, int(recv_buffer.size()));
#ifndef TORRENT_DISABLE_LOGGING
				if (should_log(peer_log_alert::info))
				{
					peer_log(peer_log_alert::info, "RECEIVE_BYTES"
						, "%*s", int(recv_buffer.size()), recv_buffer.data());
				}
#endif
				disconnect(errors::http_parse_error, operation_t::bittorrent, peer_error);
				return;
			}

			TORRENT_ASSERT(recv_buffer.empty() || recv_buffer[0] == 'H');
			TORRENT_ASSERT(int(recv_buffer.size()) <= m_recv_buffer.packet_size());

			// this means the entire status line hasn't been received yet
			if (m_parser.status_code() == -1)
			{
				TORRENT_ASSERT(payload == 0);
				break;
			}

			if (!m_parser.header_finished())
			{
				TORRENT_ASSERT(payload == 0);
				break;
			}

			m_body_start = m_parser.body_start();
			m_received_body = 0;
		}

		// we just completed reading the header
		if (!header_finished)
		{
			++m_num_responses;

			if (m_parser.connection_close())
			{
				incoming_choke();
				if (m_num_responses == 1)
					m_web->supports_keepalive = false;
			}

#ifndef TORRENT_DISABLE_LOGGING
			if (should_log(peer_log_alert::info))
			{
				peer_log(peer_log_alert::info, "STATUS"
					, "%d %s", m_parser.status_code(), m_parser.message().c_str());
				auto const& headers = m_parser.headers();
				for (auto const &i : headers)
					peer_log(peer_log_alert::info, "STATUS", "   %s: %s", i.first.c_str(), i.second.c_str());
			}
#endif

			// if the status code is not one of the accepted ones, abort
			if (!aux::is_ok_status(m_parser.status_code()))
			{
				if (!m_file_requests.empty())
				{
					file_request_t const& file_req = m_file_requests.front();
					m_web->have_files.resize(t->torrent_file().num_files(), true);
					m_web->have_files.clear_bit(file_req.file_index);

#ifndef TORRENT_DISABLE_LOGGING
					peer_log(peer_log_alert::info, "MISSING_FILE", "http-code: %d | file: %d"
						, m_parser.status_code(), static_cast<int>(file_req.file_index));
#endif
				}
				handle_error(int(recv_buffer.size()));
				return;
			}

			if (aux::is_redirect(m_parser.status_code()))
			{
				handle_redirect(int(recv_buffer.size()));
				return;
			}

			m_server_string = get_peer_name(m_parser, m_host);

			recv_buffer = recv_buffer.subspan(m_body_start);

			m_body_start = m_parser.body_start();
			m_received_body = 0;
		}

		// we only received the header, no data
		if (recv_buffer.empty()) break;

		// ===================================
		// ======= RESPONSE BYTE RANGE =======
		// ===================================

		// despite the HTTP range being inclusive, range_start and range_end are
		// exclusive to fit better into C++. i.e. range_end points one byte past
		// the end of the payload
		error_code ec;
		auto const [range_start, range_end] = get_range(m_parser, ec);
		if (ec)
		{
			received_bytes(0, int(recv_buffer.size()));
			disable(ec);
			return;
		}

		TORRENT_ASSERT(!m_file_requests.empty());
		file_request_t const& file_req = m_file_requests.front();
		if (range_start != file_req.start
			|| range_end != file_req.start + file_req.length)
		{
			// the byte range in the http response is different what we expected
			received_bytes(0, int(recv_buffer.size()));

#ifndef TORRENT_DISABLE_LOGGING
			if (should_log(peer_log_alert::incoming))
			{
				peer_log(peer_log_alert::incoming, "INVALID HTTP RESPONSE"
					, "in=(%d, %" PRId64 "-%" PRId64 ") expected=(%d, %" PRId64 "-%" PRId64 ") ]"
					, static_cast<int>(file_req.file_index), range_start, range_end
					, static_cast<int>(file_req.file_index), file_req.start, file_req.start + file_req.length - 1);
			}
#endif
			disconnect(errors::invalid_range, operation_t::bittorrent, peer_error);
			return;
		}

		if (m_parser.chunked_encoding())
		{

			// =========================
			// === CHUNKED ENCODING  ===
			// =========================

			while (m_chunk_pos >= 0 && !recv_buffer.empty())
			{
				// first deliver any payload we have in the buffer so far, ahead of
				// the next chunk header.
				if (m_chunk_pos > 0)
				{
					int const copy_size = std::min(m_chunk_pos, int(recv_buffer.size()));
					TORRENT_ASSERT(copy_size > 0);

					if (m_received_body + copy_size > file_req.length)
					{
						// the byte range in the http response is different what we expected
						received_bytes(0, int(recv_buffer.size()));

#ifndef TORRENT_DISABLE_LOGGING
						peer_log(peer_log_alert::incoming, "INVALID HTTP RESPONSE"
							, "received body: %d request size: %d"
							, m_received_body, file_req.length);
#endif
						disconnect(errors::invalid_range, operation_t::bittorrent, peer_error);
						return;
					}
					incoming_payload(recv_buffer.data(), copy_size);

					recv_buffer = recv_buffer.subspan(copy_size);
					m_chunk_pos -= copy_size;

					if (recv_buffer.empty()) goto done;
				}

				TORRENT_ASSERT(m_chunk_pos == 0);

				int header_size = 0;
				std::int64_t chunk_size = 0;
				span<char const> chunk_start = recv_buffer.subspan(m_chunk_pos);
				TORRENT_ASSERT(chunk_start[0] == '\r'
					|| aux::is_hex({chunk_start.data(), 1}));
				bool const ret = m_parser.parse_chunk_header(chunk_start, &chunk_size, &header_size);
				if (!ret)
				{
					received_bytes(0, int(chunk_start.size()) - m_partial_chunk_header);
					m_partial_chunk_header = int(chunk_start.size());
					goto done;
				}
#ifndef TORRENT_DISABLE_LOGGING
				peer_log(peer_log_alert::info, "CHUNKED_ENCODING"
					, "parsed chunk: %" PRId64 " header_size: %d"
					, chunk_size, header_size);
#endif
				received_bytes(0, header_size - m_partial_chunk_header);
				m_partial_chunk_header = 0;
				TORRENT_ASSERT(chunk_size != 0
					|| int(chunk_start.size()) <= header_size || chunk_start[header_size] == 'H');
				TORRENT_ASSERT(m_body_start + m_chunk_pos < INT_MAX);
				m_chunk_pos += int(chunk_size);
				recv_buffer = recv_buffer.subspan(header_size);

				// a chunk size of zero means the request is complete. Make sure the
				// number of payload bytes we've received matches the number we
				// requested. If that's not the case, we got an invalid response.
				if (chunk_size == 0)
				{
					TORRENT_ASSERT_VAL(m_chunk_pos == 0, m_chunk_pos);

#if TORRENT_USE_ASSERTS
					span<char const> chunk = recv_buffer.subspan(m_chunk_pos);
					TORRENT_ASSERT(chunk.size() == 0 || chunk[0] == 'H');
#endif
					m_chunk_pos = -1;

					TORRENT_ASSERT(m_received_body <= file_req.length);
					if (m_received_body != file_req.length)
					{
						// the byte range in the http response is different what we expected
						received_bytes(0, int(recv_buffer.size()));

#ifndef TORRENT_DISABLE_LOGGING
						peer_log(peer_log_alert::incoming, "INVALID HTTP RESPONSE"
							, "received body: %d request size: %d"
							, m_received_body, file_req.length);
#endif
						disconnect(errors::invalid_range, operation_t::bittorrent, peer_error);
						return;
					}
					// we just completed an HTTP file request. pop it from m_file_requests
					m_file_requests.pop_front();
					m_parser.reset();
					m_body_start = 0;
					m_received_body = 0;
					m_chunk_pos = 0;
					m_partial_chunk_header = 0;

					// in between each file request, there may be an implicit
					// pad-file request
					handle_padfile();
					break;
				}

				// if all of the receive buffer was just consumed as chunk
				// header, we're done
				if (recv_buffer.empty()) goto done;
			}
		}
		else
		{
			// this is the simple case, where we don't have chunked encoding
			TORRENT_ASSERT(m_received_body <= file_req.length);
			int const copy_size = std::min(file_req.length - m_received_body
				, int(recv_buffer.size()));
			incoming_payload(recv_buffer.data(), copy_size);
			recv_buffer = recv_buffer.subspan(copy_size);

			TORRENT_ASSERT(m_received_body <= file_req.length);
			if (m_received_body == file_req.length)
			{
				// we just completed an HTTP file request. pop it from m_file_requests
				m_file_requests.pop_front();
				m_parser.reset();
				m_body_start = 0;
				m_received_body = 0;
				m_chunk_pos = 0;
				m_partial_chunk_header = 0;

				// in between each file request, there may be an implicit
				// pad-file request
				handle_padfile();
			}
		}

		if (recv_buffer.empty()) break;
	}
done:

	// now, remove all the bytes we've processed from the receive buffer
	m_recv_buffer.cut(int(recv_buffer.data() - m_recv_buffer.get().begin())
		, t->block_size() + request_size_overhead);
}